

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O3

String * __thiscall
kj::encodeCEscape(String *__return_storage_ptr__,kj *this,ArrayPtr<const_unsigned_char> bytes)

{
  kj kVar1;
  kj *pkVar2;
  uchar *capacity;
  uint uVar3;
  kj *pkVar4;
  size_t sVar5;
  uchar *puVar6;
  Vector<char> local_58;
  String *local_38;
  
  capacity = bytes.ptr;
  local_38 = __return_storage_ptr__;
  local_58.builder.pos =
       (RemoveConst<char> *)
       _::HeapArrayDisposer::allocateImpl
                 (1,0,(size_t)capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_58.builder.endPtr = (char *)((kj *)local_58.builder.pos + (long)capacity);
  local_58.builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_58.builder.ptr = local_58.builder.pos;
  if (capacity != (uchar *)0x0) {
    puVar6 = (uchar *)0x0;
    do {
      kVar1 = this[(long)puVar6];
      uVar3 = (uint)(byte)kVar1;
      if (0x21 < (byte)kVar1) {
        if (kVar1 == (kj)0x22) {
          pkVar2 = (kj *)local_58.builder.pos + (2 - (long)local_58.builder.ptr);
          if ((kj *)(local_58.builder.endPtr + -(long)local_58.builder.ptr) < pkVar2) {
            pkVar4 = (kj *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
            if (local_58.builder.endPtr == local_58.builder.ptr) {
              pkVar4 = (kj *)0x4;
            }
            if (pkVar4 < pkVar2) {
              pkVar4 = pkVar2;
            }
            Vector<char>::setCapacity(&local_58,(size_t)pkVar4);
          }
          *(undefined2 *)local_58.builder.pos = 0x225c;
        }
        else if (uVar3 == 0x27) {
          pkVar2 = (kj *)local_58.builder.pos + (2 - (long)local_58.builder.ptr);
          if ((kj *)(local_58.builder.endPtr + -(long)local_58.builder.ptr) < pkVar2) {
            pkVar4 = (kj *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
            if (local_58.builder.endPtr == local_58.builder.ptr) {
              pkVar4 = (kj *)0x4;
            }
            if (pkVar4 < pkVar2) {
              pkVar4 = pkVar2;
            }
            Vector<char>::setCapacity(&local_58,(size_t)pkVar4);
          }
          *(undefined2 *)local_58.builder.pos = 0x275c;
        }
        else {
          if (uVar3 != 0x5c) goto switchD_0018ff46_default;
          pkVar2 = (kj *)local_58.builder.pos + (2 - (long)local_58.builder.ptr);
          if ((kj *)(local_58.builder.endPtr + -(long)local_58.builder.ptr) < pkVar2) {
            pkVar4 = (kj *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
            if (local_58.builder.endPtr == local_58.builder.ptr) {
              pkVar4 = (kj *)0x4;
            }
            if (pkVar4 < pkVar2) {
              pkVar4 = pkVar2;
            }
            Vector<char>::setCapacity(&local_58,(size_t)pkVar4);
          }
          *(undefined2 *)local_58.builder.pos = 0x5c5c;
        }
        goto LAB_00190377;
      }
      switch(kVar1) {
      case (kj)0x7:
        pkVar2 = (kj *)local_58.builder.pos + (2 - (long)local_58.builder.ptr);
        if ((kj *)(local_58.builder.endPtr + -(long)local_58.builder.ptr) < pkVar2) {
          pkVar4 = (kj *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
          if (local_58.builder.endPtr == local_58.builder.ptr) {
            pkVar4 = (kj *)0x4;
          }
          if (pkVar4 < pkVar2) {
            pkVar4 = pkVar2;
          }
          Vector<char>::setCapacity(&local_58,(size_t)pkVar4);
        }
        *(undefined2 *)local_58.builder.pos = 0x615c;
        break;
      case (kj)0x8:
        pkVar2 = (kj *)local_58.builder.pos + (2 - (long)local_58.builder.ptr);
        if ((kj *)(local_58.builder.endPtr + -(long)local_58.builder.ptr) < pkVar2) {
          pkVar4 = (kj *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
          if (local_58.builder.endPtr == local_58.builder.ptr) {
            pkVar4 = (kj *)0x4;
          }
          if (pkVar4 < pkVar2) {
            pkVar4 = pkVar2;
          }
          Vector<char>::setCapacity(&local_58,(size_t)pkVar4);
        }
        *(undefined2 *)local_58.builder.pos = 0x625c;
        break;
      case (kj)0x9:
        pkVar2 = (kj *)local_58.builder.pos + (2 - (long)local_58.builder.ptr);
        if ((kj *)(local_58.builder.endPtr + -(long)local_58.builder.ptr) < pkVar2) {
          pkVar4 = (kj *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
          if (local_58.builder.endPtr == local_58.builder.ptr) {
            pkVar4 = (kj *)0x4;
          }
          if (pkVar4 < pkVar2) {
            pkVar4 = pkVar2;
          }
          Vector<char>::setCapacity(&local_58,(size_t)pkVar4);
        }
        *(undefined2 *)local_58.builder.pos = 0x745c;
        break;
      case (kj)0xa:
        pkVar2 = (kj *)local_58.builder.pos + (2 - (long)local_58.builder.ptr);
        if ((kj *)(local_58.builder.endPtr + -(long)local_58.builder.ptr) < pkVar2) {
          pkVar4 = (kj *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
          if (local_58.builder.endPtr == local_58.builder.ptr) {
            pkVar4 = (kj *)0x4;
          }
          if (pkVar4 < pkVar2) {
            pkVar4 = pkVar2;
          }
          Vector<char>::setCapacity(&local_58,(size_t)pkVar4);
        }
        *(undefined2 *)local_58.builder.pos = 0x6e5c;
        break;
      case (kj)0xb:
        pkVar2 = (kj *)local_58.builder.pos + (2 - (long)local_58.builder.ptr);
        if ((kj *)(local_58.builder.endPtr + -(long)local_58.builder.ptr) < pkVar2) {
          pkVar4 = (kj *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
          if (local_58.builder.endPtr == local_58.builder.ptr) {
            pkVar4 = (kj *)0x4;
          }
          if (pkVar4 < pkVar2) {
            pkVar4 = pkVar2;
          }
          Vector<char>::setCapacity(&local_58,(size_t)pkVar4);
        }
        *(undefined2 *)local_58.builder.pos = 0x765c;
        break;
      case (kj)0xc:
        pkVar2 = (kj *)local_58.builder.pos + (2 - (long)local_58.builder.ptr);
        if ((kj *)(local_58.builder.endPtr + -(long)local_58.builder.ptr) < pkVar2) {
          pkVar4 = (kj *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
          if (local_58.builder.endPtr == local_58.builder.ptr) {
            pkVar4 = (kj *)0x4;
          }
          if (pkVar4 < pkVar2) {
            pkVar4 = pkVar2;
          }
          Vector<char>::setCapacity(&local_58,(size_t)pkVar4);
        }
        *(undefined2 *)local_58.builder.pos = 0x665c;
        break;
      case (kj)0xd:
        pkVar2 = (kj *)local_58.builder.pos + (2 - (long)local_58.builder.ptr);
        if ((kj *)(local_58.builder.endPtr + -(long)local_58.builder.ptr) < pkVar2) {
          pkVar4 = (kj *)((long)(local_58.builder.endPtr + -(long)local_58.builder.ptr) * 2);
          if (local_58.builder.endPtr == local_58.builder.ptr) {
            pkVar4 = (kj *)0x4;
          }
          if (pkVar4 < pkVar2) {
            pkVar4 = pkVar2;
          }
          Vector<char>::setCapacity(&local_58,(size_t)pkVar4);
        }
        *(undefined2 *)local_58.builder.pos = 0x725c;
        break;
      default:
switchD_0018ff46_default:
        if ((byte)kVar1 < 0x20 || kVar1 == (kj)0x7f) {
          if (local_58.builder.pos == local_58.builder.endPtr) {
            sVar5 = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
            if (local_58.builder.pos == local_58.builder.ptr) {
              sVar5 = 4;
            }
            Vector<char>::setCapacity(&local_58,sVar5);
          }
          *local_58.builder.pos = '\\';
          local_58.builder.pos = local_58.builder.pos + 1;
          if (local_58.builder.pos == local_58.builder.endPtr) {
            sVar5 = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
            if (local_58.builder.pos == local_58.builder.ptr) {
              sVar5 = 4;
            }
            Vector<char>::setCapacity(&local_58,sVar5);
          }
          *local_58.builder.pos =
               (RemoveConst<char>)*(kj *)("0123456789abcdef" + ((byte)kVar1 >> 6));
          local_58.builder.pos = local_58.builder.pos + 1;
          if (local_58.builder.pos == local_58.builder.endPtr) {
            sVar5 = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
            if (local_58.builder.pos == local_58.builder.ptr) {
              sVar5 = 4;
            }
            Vector<char>::setCapacity(&local_58,sVar5);
          }
          *local_58.builder.pos =
               (RemoveConst<char>)*(kj *)("0123456789abcdef" + ((byte)kVar1 >> 3 & 7));
          local_58.builder.pos = local_58.builder.pos + 1;
          if (local_58.builder.pos == local_58.builder.endPtr) {
            sVar5 = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
            if (local_58.builder.pos == local_58.builder.ptr) {
              sVar5 = 4;
            }
            Vector<char>::setCapacity(&local_58,sVar5);
          }
          *local_58.builder.pos = (RemoveConst<char>)*(kj *)("0123456789abcdef" + (uVar3 & 7));
        }
        else {
          if (local_58.builder.pos == local_58.builder.endPtr) {
            sVar5 = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
            if (local_58.builder.pos == local_58.builder.ptr) {
              sVar5 = 4;
            }
            Vector<char>::setCapacity(&local_58,sVar5);
          }
          *local_58.builder.pos = (RemoveConst<char>)kVar1;
        }
        local_58.builder.pos = local_58.builder.pos + 1;
        goto LAB_0019037b;
      }
LAB_00190377:
      local_58.builder.pos = (RemoveConst<char> *)((kj *)local_58.builder.pos + 2);
LAB_0019037b:
      puVar6 = puVar6 + 1;
    } while (capacity != puVar6);
  }
  if (local_58.builder.pos == local_58.builder.endPtr) {
    sVar5 = 4;
    if (local_58.builder.endPtr != local_58.builder.ptr) {
      sVar5 = ((long)local_58.builder.endPtr - (long)local_58.builder.ptr) * 2;
    }
    Vector<char>::setCapacity(&local_58,sVar5);
  }
  *local_58.builder.pos = '\0';
  local_58.builder.pos = local_58.builder.pos + 1;
  if (local_58.builder.pos != local_58.builder.endPtr) {
    Vector<char>::setCapacity(&local_58,(long)local_58.builder.pos - (long)local_58.builder.ptr);
  }
  (local_38->content).ptr = local_58.builder.ptr;
  (local_38->content).size_ = (long)local_58.builder.pos - (long)local_58.builder.ptr;
  (local_38->content).disposer = local_58.builder.disposer;
  return local_38;
}

Assistant:

String encodeCEscape(ArrayPtr<const byte> bytes) {
  Vector<char> escaped(bytes.size());

  for (byte b: bytes) {
    switch (b) {
      case '\a': escaped.addAll(StringPtr("\\a")); break;
      case '\b': escaped.addAll(StringPtr("\\b")); break;
      case '\f': escaped.addAll(StringPtr("\\f")); break;
      case '\n': escaped.addAll(StringPtr("\\n")); break;
      case '\r': escaped.addAll(StringPtr("\\r")); break;
      case '\t': escaped.addAll(StringPtr("\\t")); break;
      case '\v': escaped.addAll(StringPtr("\\v")); break;
      case '\'': escaped.addAll(StringPtr("\\\'")); break;
      case '\"': escaped.addAll(StringPtr("\\\"")); break;
      case '\\': escaped.addAll(StringPtr("\\\\")); break;
      default:
        if (b < 0x20 || b == 0x7f) {
          // Use octal escape, not hex, because hex escapes technically have no length limit and
          // so can create ambiguity with subsequent characters.
          escaped.add('\\');
          escaped.add(HEX_DIGITS[b / 64]);
          escaped.add(HEX_DIGITS[(b / 8) % 8]);
          escaped.add(HEX_DIGITS[b % 8]);
        } else {
          escaped.add(b);
        }
        break;
    }
  }

  escaped.add(0);
  return String(escaped.releaseAsArray());
}